

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeysTool_test.cpp
# Opt level: O1

void __thiscall jbcoin::tests::ValidatorKeysTool_test::testCreateToken(ValidatorKeysTool_test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  suite *psVar2;
  anon_class_8_1_8991fb9c testToken;
  path keyFile;
  KeyType keyType;
  string expectedError;
  CoutRedirect coutRedirect;
  string subdir;
  string expectedError_2;
  pair<jbcoin::PublicKey,_jbcoin::SecretKey> kp;
  KeyFileGuard g;
  stringstream coutCapture;
  anon_class_8_1_8991fb9c local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  KeyType local_2dc;
  undefined1 local_2d8 [56];
  SecretKey local_2a0;
  CoutRedirect local_278;
  string local_270;
  string local_250;
  undefined1 local_230 [48];
  SecretKey local_200;
  KeyFileGuard local_1e0;
  string local_1b8 [4];
  ios_base local_138 [264];
  
  local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Create Token","");
  psVar2 = (this->super_suite).testcase.suite_;
  psVar2->abort_ = false;
  beast::unit_test::runner::testcase<void>(psVar2->runner_,local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
    operator_delete(local_1b8[0]._M_dataplus._M_p,local_1b8[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  local_278.old_ =
       (streambuf *)std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"test_key_file","");
  KeyFileGuard::KeyFileGuard(&local_1e0,&this->super_suite,&local_270);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_2d8 + 0x10);
  local_2d8._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2d8,local_270._M_dataplus._M_p,
             local_270._M_dataplus._M_p + local_270._M_string_length);
  local_230._0_8_ = local_230 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"validator_keys.json","");
  boost::filesystem::path::operator/=((path *)local_2d8,(path *)local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._0_8_ == paVar1) {
    local_300.field_2._8_8_ = local_2d8._24_8_;
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  }
  else {
    local_300._M_dataplus._M_p = (pointer)local_2d8._0_8_;
  }
  local_300.field_2._M_allocated_capacity._1_7_ = local_2d8._17_7_;
  local_300.field_2._M_local_buf[0] = local_2d8[0x10];
  local_300._M_string_length = local_2d8._8_8_;
  local_2d8._8_8_ = 0;
  local_2d8[0x10] = '\0';
  local_2d8._0_8_ = paVar1;
  if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._0_8_ != paVar1) {
    operator_delete((void *)local_2d8._0_8_,CONCAT71(local_2d8._17_7_,local_2d8[0x10]) + 1);
  }
  local_308.this = this;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                 "Failed to open key file: ",&local_300);
  testCreateToken::anon_class_8_1_8991fb9c::operator()
            (&local_308,(path *)&local_300,(string *)local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._0_8_ != paVar1) {
    operator_delete((void *)local_2d8._0_8_,CONCAT71(local_2d8._17_7_,local_2d8[0x10]) + 1);
  }
  createKeyFile((path *)&local_300);
  local_2d8._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"");
  testCreateToken::anon_class_8_1_8991fb9c::operator()
            (&local_308,(path *)&local_300,(string *)local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._0_8_ != paVar1) {
    operator_delete((void *)local_2d8._0_8_,CONCAT71(local_2d8._17_7_,local_2d8[0x10]) + 1);
  }
  local_2dc = ed25519;
  randomSeed();
  generateKeyPair((pair<jbcoin::PublicKey,_jbcoin::SecretKey> *)local_230,ed25519,(Seed *)local_2d8)
  ;
  Seed::~Seed((Seed *)local_2d8);
  ValidatorKeys::ValidatorKeys((ValidatorKeys *)local_2d8,&local_2dc,&local_200,0xfffffffe,false);
  ValidatorKeys::writeToFile((ValidatorKeys *)local_2d8,(path *)&local_300);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_250,
             "Maximum number of tokens have already been generated.\nRevoke validator keys if previous token has been compromised."
             ,"");
  testCreateToken::anon_class_8_1_8991fb9c::operator()(&local_308,(path *)&local_300,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  SecretKey::~SecretKey(&local_2a0);
  SecretKey::~SecretKey(&local_200);
  createRevocation((path *)&local_300);
  local_2d8._0_8_ = paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d8,"Validator keys have been revoked.","");
  testCreateToken::anon_class_8_1_8991fb9c::operator()
            (&local_308,(path *)&local_300,(string *)local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._0_8_ != paVar1) {
    operator_delete((void *)local_2d8._0_8_,CONCAT71(local_2d8._17_7_,local_2d8[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  KeyFileGuard::~KeyFileGuard(&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  CoutRedirect::~CoutRedirect(&local_278);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void
    testCreateToken ()
    {
        testcase ("Create Token");

        std::stringstream coutCapture;
        CoutRedirect coutRedirect {coutCapture};

        using namespace boost::filesystem;

        std::string const subdir = "test_key_file";
        KeyFileGuard const g (*this, subdir);
        path const keyFile = subdir / "validator_keys.json";

        auto testToken = [this](
            path const& keyFile,
            std::string const& expectedError)
        {
            try
            {
                createToken (keyFile);
                BEAST_EXPECT(expectedError.empty());
            }
            catch (std::exception const& e)
            {
                BEAST_EXPECT(e.what() == expectedError);
            }
        };

        {
            std::string const expectedError =
                "Failed to open key file: " + keyFile.string();
            testToken (keyFile, expectedError);
        }

        createKeyFile (keyFile);

        {
            std::string const expectedError = "";
            testToken (keyFile, expectedError);
        }
        {
            auto const keyType = KeyType::ed25519;
            auto const kp = generateKeyPair (keyType, randomSeed ());

            auto keys = ValidatorKeys (
                keyType,
                kp.second,
                std::numeric_limits<std::uint32_t>::max () - 1);

            keys.writeToFile (keyFile);
            std::string const expectedError =
                "Maximum number of tokens have already been generated.\n"
                "Revoke validator keys if previous token has been compromised.";
            testToken (keyFile, expectedError);
        }
        {
            createRevocation (keyFile);
            std::string const expectedError =
                "Validator keys have been revoked.";
            testToken (keyFile, expectedError);
        }
    }